

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_DebugStringRoundTrip_Test::
FileDescriptorTest_DebugStringRoundTrip_Test(FileDescriptorTest_DebugStringRoundTrip_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FileDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FileDescriptorTest_01881e50;
  DescriptorPool::DescriptorPool(&(this->super_FileDescriptorTest).pool_);
  (this->super_FileDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FileDescriptorTest_01876c88;
  return;
}

Assistant:

TEST_F(FileDescriptorTest, DebugStringRoundTrip) {
  absl::flat_hash_set<absl::string_view> visited;
  std::vector<std::pair<absl::string_view, std::string>> debug_strings;
  ExtractDebugString(proto2_unittest::TestAllTypes::descriptor()->file(),
                     &visited, &debug_strings);
  ExtractDebugString(
      proto2_unittest::TestMessageWithCustomOptions::descriptor()->file(),
      &visited, &debug_strings);
  ExtractDebugString(proto3_arena_unittest::TestAllTypes::descriptor()->file(),
                     &visited, &debug_strings);
  ASSERT_GE(debug_strings.size(), 3);

  DescriptorPool pool;
  for (size_t i = 0; i < debug_strings.size(); ++i) {
    const absl::string_view name = debug_strings[i].first;
    const std::string& content = debug_strings[i].second;
    io::ArrayInputStream input_stream(content.data(), content.size());
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    compiler::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ASSERT_TRUE(parser.Parse(&tokenizer, &proto))
        << error_collector.last_error() << "\n"
        << content;
    ASSERT_EQ("", error_collector.last_error());
    proto.set_name(name);
    const FileDescriptor* descriptor = pool.BuildFile(proto);
    ASSERT_TRUE(descriptor != nullptr) << error_collector.last_error();
    EXPECT_EQ(content, descriptor->DebugString());
  }
}